

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

cmpResult __thiscall llvm::detail::DoubleAPFloat::compare(DoubleAPFloat *this,DoubleAPFloat *RHS)

{
  cmpResult cVar1;
  
  cVar1 = APFloat::compare((this->Floats)._M_t.
                           super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                           .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl,
                           (RHS->Floats)._M_t.
                           super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                           .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl);
  if (cVar1 == cmpEqual) {
    cVar1 = APFloat::compare((this->Floats)._M_t.
                             super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                             .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,
                             (RHS->Floats)._M_t.
                             super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                             .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1);
    return cVar1;
  }
  return cVar1;
}

Assistant:

APFloat::cmpResult DoubleAPFloat::compare(const DoubleAPFloat &RHS) const {
  auto Result = Floats[0].compare(RHS.Floats[0]);
  // |Float[0]| > |Float[1]|
  if (Result == APFloat::cmpEqual)
    return Floats[1].compare(RHS.Floats[1]);
  return Result;
}